

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FAudio_internal_simd.c
# Opt level: O2

void FAudio_INTERNAL_Mix_1in_2out_Scalar
               (uint32_t toMix,uint32_t UNUSED1,uint32_t UNUSED2,float baseVolume,float *src,
               float *dst,float *channelVolume,float *coefficients)

{
  float fVar1;
  long lVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  
  fVar1 = *channelVolume;
  for (lVar2 = 0; toMix != (uint32_t)lVar2; lVar2 = lVar2 + 1) {
    fVar3 = src[lVar2] * baseVolume * fVar1;
    fVar4 = *coefficients * fVar3 + dst[lVar2 * 2];
    fVar5 = 16777216.0;
    if ((fVar4 <= 16777216.0) && (fVar5 = -16777216.0, -16777216.0 <= fVar4)) {
      fVar5 = fVar4;
    }
    fVar3 = fVar3 * coefficients[1] + dst[lVar2 * 2 + 1];
    dst[lVar2 * 2] = fVar5;
    fVar5 = 16777216.0;
    if ((fVar3 <= 16777216.0) && (fVar5 = -16777216.0, -16777216.0 <= fVar3)) {
      fVar5 = fVar3;
    }
    dst[lVar2 * 2 + 1] = fVar5;
  }
  return;
}

Assistant:

void FAudio_INTERNAL_Mix_1in_2out_Scalar(
	uint32_t toMix,
	uint32_t UNUSED1,
	uint32_t UNUSED2,
	float baseVolume,
	float *restrict src,
	float *restrict dst,
	float *restrict channelVolume,
	float *restrict coefficients
) {
	uint32_t i;
	float totalVolume = baseVolume * channelVolume[0];
	for (i = 0; i < toMix; i += 1, src += 1, dst += 2)
	{
		/* Base source data... */
		const float sample = src[0] * totalVolume;

		/* ... combined with the coefficients... */
		dst[0] += sample * coefficients[0];
		dst[1] += sample * coefficients[1];

		/* ... then clamped. */
		dst[0] = FAudio_clamp(
			dst[0],
			-FAUDIO_MAX_VOLUME_LEVEL,
			FAUDIO_MAX_VOLUME_LEVEL
		);
		dst[1] = FAudio_clamp(
			dst[1],
			-FAUDIO_MAX_VOLUME_LEVEL,
			FAUDIO_MAX_VOLUME_LEVEL
		);
	}
}